

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setter_argument_mutator.hpp
# Opt level: O0

StringHolder *
prop::detail::SetterArgumentMutator<StringHolder,_const_char_*,_true>::adapt
          (StringHolder *__return_storage_ptr__,char **value)

{
  char *pcVar1;
  allocator local_39;
  string local_38;
  char **local_18;
  char **value_local;
  
  pcVar1 = *value;
  local_18 = value;
  value_local = (char **)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
  StringHolder::StringHolder(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

static SetterType adapt( IncomingType&& value )
  {
    return static_cast< SetterType >( std::move( value ) );
  }